

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_module.cpp
# Opt level: O0

ModBody * __thiscall
pfederc::Parser::parseModBody(ModBody *__return_storage_ptr__,Parser *this,bool isprog)

{
  bool bVar1;
  ExprType EVar2;
  Token *pTVar3;
  const_iterator __first;
  const_iterator __last;
  type pEVar4;
  BiOpExpr *this_00;
  Expr *expr_00;
  pointer pEVar5;
  ProgNameExpr *this_01;
  bool local_199;
  bool local_179;
  undefined1 local_140 [24];
  undefined1 local_128 [28];
  undefined4 local_10c;
  undefined1 local_108 [24];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *local_f0;
  ExprType *local_e8;
  __normal_iterator<const_pfederc::ExprType_*,_std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>_>
  local_e0;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *local_d8;
  ExprType *local_d0;
  __normal_iterator<const_pfederc::ExprType_*,_std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>_>
  local_c8;
  bool local_b9;
  undefined1 local_b8 [7];
  bool validexpr;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_b0;
  undefined1 local_a8 [32];
  undefined1 local_88 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Token *local_68;
  Token *tok;
  undefined1 local_58 [7];
  bool err;
  Exprs defs;
  Exprs imports;
  Token *progName;
  bool isprog_local;
  Parser *this_local;
  
  imports.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)&defs.
               super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            *)local_58);
  tok._7_1_ = 0;
  while( true ) {
    pTVar3 = Lexer::getCurrentToken(this->lexer);
    bVar1 = Token::operator!=(pTVar3,TOK_EOL);
    if (!bVar1) break;
    while( true ) {
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_EOL);
      if (!bVar1) break;
      Lexer::next(this->lexer);
    }
    pTVar3 = Lexer::getCurrentToken(this->lexer);
    bVar1 = Token::operator==(pTVar3,TOK_EOF);
    if (bVar1) break;
    local_68 = Lexer::getCurrentToken(this->lexer);
    if (!isprog) {
      __first = std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>::begin
                          (&_TERMINATE_MOD_TOKEN);
      __last = std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>::end
                         (&_TERMINATE_MOD_TOKEN);
      expr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
           &stack0xffffffffffffff98;
      bVar1 = std::
              any_of<__gnu_cxx::__normal_iterator<pfederc::TokenType_const*,std::vector<pfederc::TokenType,std::allocator<pfederc::TokenType>>>,pfederc::Parser::parseModBody(bool)::__0>
                        ((__normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
                          )__first._M_current,
                         (__normal_iterator<const_pfederc::TokenType_*,_std::vector<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>_>
                          )__last._M_current,
                         (anon_class_8_1_ba1d7cb0_for__M_pred)
                         expr._M_t.
                         super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                         .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
      if (bVar1) break;
    }
    parseExpression((Parser *)local_88,(Precedence)this);
    if (isprog) {
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar3,TOK_EOF);
      if (!bVar1) goto LAB_0013ddaf;
LAB_0013ddb9:
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator!=(pTVar3,TOK_EOL);
      if (!bVar1) goto LAB_0013deee;
      if (isprog) {
        local_a8._14_2_ = 2;
        local_a8._8_4_ = 0x11;
        pTVar3 = Lexer::getCurrentToken(this->lexer);
        Token::getPosition(pTVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)(local_a8 + 0x10),(SyntaxErrorCode *)(local_a8 + 0xe),
                   (Position *)(local_a8 + 8));
        generateError((Parser *)(local_a8 + 0x18),
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   (local_a8 + 0x18));
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)(local_a8 + 0x10));
      }
      else {
        stack0xffffffffffffff4e = 2;
        local_b8._0_4_ = 0xf;
        pTVar3 = Lexer::getCurrentToken(this->lexer);
        Token::getPosition(pTVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&local_b0,(SyntaxErrorCode *)(local_b8 + 6),(Position *)local_b8);
        generateError((Parser *)local_a8,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_a8);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_b0);
      }
      tok._7_1_ = 1;
      skipToStmtEol(this);
    }
    else {
LAB_0013ddaf:
      if (!isprog) goto LAB_0013ddb9;
LAB_0013deee:
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      bVar1 = Token::operator==(pTVar3,TOK_EOL);
      if (bVar1) {
        Lexer::next(this->lexer);
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_88);
    if (bVar1) {
      if (isprog) {
        local_c8._M_current =
             (ExprType *)
             std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>::begin
                       (&_ALLOWED_EXPR_PROG);
        local_d0 = (ExprType *)
                   std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>::end
                             (&_ALLOWED_EXPR_PROG);
        local_d8 = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_88;
        bVar1 = std::
                any_of<__gnu_cxx::__normal_iterator<pfederc::ExprType_const*,std::vector<pfederc::ExprType,std::allocator<pfederc::ExprType>>>,pfederc::Parser::parseModBody(bool)::__1>
                          (local_c8,(__normal_iterator<const_pfederc::ExprType_*,_std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>_>
                                     )local_d0,(anon_class_8_1_898b66f3_for__M_pred)local_d8);
      }
      else {
        local_e0._M_current =
             (ExprType *)
             std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>::begin
                       (&_ALLOWED_EXPR_MOD);
        local_e8 = (ExprType *)
                   std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>::end
                             (&_ALLOWED_EXPR_MOD);
        local_f0 = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_88;
        bVar1 = std::
                any_of<__gnu_cxx::__normal_iterator<pfederc::ExprType_const*,std::vector<pfederc::ExprType,std::allocator<pfederc::ExprType>>>,pfederc::Parser::parseModBody(bool)::__2>
                          (local_e0,(__normal_iterator<const_pfederc::ExprType_*,_std::vector<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>_>
                                     )local_e8,(anon_class_8_1_898b66f3_for__M_pred)local_f0);
      }
      local_179 = true;
      if (!bVar1) {
        pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_88);
        bVar1 = isBiOpExpr(pEVar4,TOK_OP_ASG_DCL);
        local_179 = true;
        if (!bVar1) {
          pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                             ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                              local_88);
          bVar1 = isBiOpExpr(pEVar4,TOK_OP_ASG);
          local_199 = false;
          if (bVar1) {
            pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                               ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                                local_88);
            this_00 = (BiOpExpr *)__dynamic_cast(pEVar4,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
            if (this_00 == (BiOpExpr *)0x0) {
              __cxa_bad_cast();
            }
            expr_00 = BiOpExpr::getLeft(this_00);
            local_199 = isBiOpExpr(expr_00,TOK_OP_DCL);
          }
          local_179 = local_199;
        }
      }
      local_b9 = local_179;
      if (local_179 != false) {
        pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_88);
        EVar2 = Expr::getType(pEVar5);
        if (EVar2 == EXPR_PROGNAME) {
          if (imports.
              super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                               ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                                local_88);
            this_01 = (ProgNameExpr *)
                      __dynamic_cast(pEVar4,&Expr::typeinfo,&ProgNameExpr::typeinfo,0);
            if (this_01 == (ProgNameExpr *)0x0) {
              __cxa_bad_cast();
            }
            imports.
            super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)ProgNameExpr::getTokenPtr(this_01);
          }
          else {
            local_128._6_2_ = 2;
            local_128._0_4_ = 0x14;
            pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                               ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                                local_88);
            Expr::getPosition(pEVar5);
            std::
            make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                      ((Level *)(local_128 + 8),(SyntaxErrorCode *)(local_128 + 6),
                       (Position *)local_128);
            generateError((Parser *)(local_128 + 0x10),
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        (local_128 + 0x10));
            std::
            unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
            ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)(local_128 + 8));
            tok._7_1_ = 1;
          }
        }
        else if (EVar2 == EXPR_USE) {
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::push_back((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       *)&defs.
                          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_88)
          ;
        }
        else {
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::push_back((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       *)local_58,(value_type *)local_88);
        }
        goto LAB_0013e2cb;
      }
      local_108._6_2_ = 2;
      local_108._0_4_ = 0x12;
      pEVar5 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_88
                         );
      Expr::getPosition(pEVar5);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_108 + 8),(SyntaxErrorCode *)(local_108 + 6),(Position *)local_108);
      generateError((Parser *)(local_108 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_108 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_108 + 8));
      tok._7_1_ = 1;
      local_10c = 2;
    }
    else {
LAB_0013e2cb:
      local_10c = 0;
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_88);
  }
  if (isprog) {
    pTVar3 = Lexer::getCurrentToken(this->lexer);
    bVar1 = Token::operator!=(pTVar3,TOK_EOF);
    if (bVar1) {
      local_140._6_2_ = 2;
      local_140._0_4_ = 0x10;
      pTVar3 = Lexer::getCurrentToken(this->lexer);
      Token::getPosition(pTVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_140 + 8),(SyntaxErrorCode *)(local_140 + 6),(Position *)local_140);
      generateError((Parser *)(local_140 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)this);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_140 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_140 + 8));
      tok._7_1_ = 1;
    }
  }
  std::
  tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
  ::
  tuple<const_pfederc::Token_*&,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool_&,_true,_true>
            (__return_storage_ptr__,
             (Token **)
             &imports.
              super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              *)&defs.
                 super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              *)local_58,(bool *)((long)&tok + 7));
  local_10c = 1;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             *)local_58);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             *)&defs.
                super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

ModBody Parser::parseModBody(bool isprog) noexcept {
  const Token *progName{nullptr};
  Exprs imports;
  Exprs defs;

  bool err = false;

  while(*lexer.getCurrentToken() != TokenType::TOK_EOL) {
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next(); // eat eols
    if (*lexer.getCurrentToken() == TokenType::TOK_EOF)
      break;

    const Token *tok = lexer.getCurrentToken();

    // terminate module on termination token
    if (!isprog && std::any_of(
        _TERMINATE_MOD_TOKEN.begin(), _TERMINATE_MOD_TOKEN.end(),
        [&tok](TokenType type) { return *tok == type; }))
      break;

    std::unique_ptr<Expr> expr(parseExpression());
    if (((isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF)
        || !isprog)
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      if (isprog)
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOF_EOL, lexer.getCurrentToken()->getPosition()));
      else
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      err = true;

      skipToStmtEol();
    } else if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
    }

    if (expr) {
      const bool validexpr = (isprog ?
        std::any_of(_ALLOWED_EXPR_PROG.begin(), _ALLOWED_EXPR_PROG.end(),
          [&expr](ExprType type) { return expr->getType() == type; }) :
        std::any_of(_ALLOWED_EXPR_MOD.begin(), _ALLOWED_EXPR_MOD.end(),
          [&expr](ExprType type) { return expr->getType() == type; })) ||
      // valid global assignments
        isBiOpExpr(*expr, TokenType::TOK_OP_ASG_DCL) ||
        (isBiOpExpr(*expr, TokenType::TOK_OP_ASG) &&
        isBiOpExpr(dynamic_cast<BiOpExpr&>(*expr).getLeft(), TokenType::TOK_OP_DCL));

      if (!validexpr) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_EXPR, expr->getPosition()));
        err = true;
        continue;
      }

      switch (expr->getType()) {
      case ExprType::EXPR_PROGNAME:
        if (progName) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_PROGNAME, expr->getPosition()));
          err = true;
        } else
          progName = dynamic_cast<ProgNameExpr&>(*expr).getTokenPtr();

        break;
      case ExprType::EXPR_USE:
        imports.push_back(std::move(expr));
        break;
      default:
        defs.push_back(std::move(expr));
        break;
      }
    }
  }

  if (isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOF, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  return ModBody(progName, std::move(imports), std::move(defs), err);
}